

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O2

bool FitTrackIBMPC(CylHead *cylhead,Track *track,int track_time_ms,FitDetails *details)

{
  int *t;
  DataRate datarate;
  Encoding encoding;
  int iVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Sector *pSVar7;
  LogHelper *pLVar8;
  int i_2;
  int i;
  long lVar9;
  int local_8c;
  int local_88;
  allocator_type local_81;
  int *local_80;
  int local_74;
  CylHead *local_70;
  DataRate local_68;
  int local_64;
  ulong local_60;
  vector<int,_std::allocator<int>_> sizes;
  
  local_74 = track_time_ms;
  bVar3 = Track::empty(track);
  if ((bVar3) || (bVar3 = Track::is_mixed_encoding(track), bVar3)) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    pSVar7 = Track::operator[](track,0);
    datarate = pSVar7->datarate;
    pSVar7 = Track::operator[](track,0);
    encoding = pSVar7->encoding;
    local_60 = (ulong)encoding;
    if (0xfffffffd < encoding - RX02) {
      local_70 = cylhead;
      local_68 = datarate;
      local_64 = GetTrackCapacity(local_74,datarate,encoding);
      iVar1 = 0x21;
      if (encoding == MFM) {
        iVar1 = 0x3e;
      }
      iVar5 = Track::size(track);
      std::vector<int,_std::allocator<int>_>::resize(&details->sector_units,(long)iVar5);
      iVar5 = Track::size(track);
      std::vector<int,_std::allocator<int>_>::vector(&sizes,(long)iVar5,&local_81);
      t = &details->size_code;
      local_80 = &details->gap3;
      bVar3 = true;
      do {
        details->real_errors = bVar3;
        local_8c = 7;
        local_88 = 0;
        bVar3 = true;
        for (lVar9 = 0; iVar5 = Track::size(track), lVar9 < iVar5; lVar9 = lVar9 + 1) {
          pSVar7 = Track::operator[](track,(int)lVar9);
          if ((details->real_errors != false) || (bVar4 = Sector::has_good_data(pSVar7), bVar4)) {
            iVar5 = Sector::SizeCodeToRealSizeCode((pSVar7->header).size);
            sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar9] = iVar5;
            bVar4 = Sector::has_good_data(pSVar7);
            if (local_88 < iVar5) {
              local_88 = iVar5;
            }
            if (iVar5 <= local_8c) {
              local_8c = iVar5;
            }
            bVar3 = (bool)(bVar3 & !bVar4);
          }
          else {
            sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar9] = -1;
          }
        }
        if (bVar3) {
          local_88 = 7;
        }
        while (*t = local_88, -1 < local_88) {
          details->total_units = 0;
          for (lVar9 = 0; iVar5 = Track::size(track), lVar9 < iVar5; lVar9 = lVar9 + 1) {
            iVar5 = sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9];
            iVar6 = 1;
            if ((-1 < iVar5) && (*t <= iVar5)) {
              iVar6 = Sector::SizeCodeToLength(iVar5);
              iVar5 = Sector::SizeCodeToLength(*t);
              iVar6 = iVar6 / iVar5;
            }
            (details->sector_units).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9] = iVar6;
            details->total_units = details->total_units + iVar6;
          }
          if (details->total_units != 0) {
            iVar5 = GetFormatGap(local_74,local_68,(Encoding)local_60,details->total_units,*t);
            *local_80 = iVar5;
            if (iVar5 != 0) {
              bVar3 = true;
              if ((opt.debug != 0) &&
                 ((iVar1 = details->total_units, iVar5 = Track::size(track), piVar2 = local_80,
                  iVar1 != iVar5 || (opt.verbose != 0)))) {
                pLVar8 = util::operator<<((LogHelper *)&util::cout,(char (*) [11])"FitTrack: ");
                pLVar8 = util::operator<<(pLVar8,local_70);
                pLVar8 = util::operator<<(pLVar8,(char (*) [12])" fits with ");
                pLVar8 = util::operator<<(pLVar8,&details->total_units);
                pLVar8 = util::operator<<(pLVar8,(char (*) [16])0x1a9b07);
                pLVar8 = util::operator<<(pLVar8,t);
                pLVar8 = util::operator<<(pLVar8,(char (*) [7])0x1a835b);
                pLVar8 = util::operator<<(pLVar8,piVar2);
                util::operator<<(pLVar8,(char (*) [2])0x1a83c6);
              }
              goto LAB_0016a8c9;
            }
          }
          local_88 = *t + -1;
        }
        while (*t = local_8c, -1 < local_8c) {
          iVar5 = 0xff;
          while( true ) {
            *local_80 = iVar5;
            if (iVar5 < 1) break;
            iVar5 = Sector::SizeCodeToLength(*t);
            iVar5 = iVar5 + iVar1 + details->gap3;
            details->total_units = 0;
            for (lVar9 = 0; iVar6 = Track::size(track), lVar9 < iVar6; lVar9 = lVar9 + 1) {
              iVar6 = sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar9];
              if (iVar6 < 0) {
                iVar6 = *t;
              }
              iVar6 = Sector::SizeCodeToLength(iVar6);
              iVar6 = (iVar6 + iVar1 + -1 + iVar5) / iVar5;
              (details->sector_units).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9] = iVar6;
              details->total_units = details->total_units + iVar6;
            }
            iVar5 = GetFormatLength((Encoding)local_60,details->total_units,details->size_code,
                                    details->gap3);
            if (iVar5 < local_64) {
              bVar3 = true;
              if (opt.debug != 0) {
                pLVar8 = util::operator<<((LogHelper *)&util::cout,(char (*) [11])"FitTrack: ");
                piVar2 = local_80;
                pLVar8 = util::operator<<(pLVar8,local_70);
                pLVar8 = util::operator<<(pLVar8,(char (*) [12])" fits with ");
                pLVar8 = util::operator<<(pLVar8,&details->total_units);
                pLVar8 = util::operator<<(pLVar8,(char (*) [24])" clipped units of size=");
                pLVar8 = util::operator<<(pLVar8,t);
                pLVar8 = util::operator<<(pLVar8,(char (*) [7])0x1a835b);
                pLVar8 = util::operator<<(pLVar8,piVar2);
                util::operator<<(pLVar8,(char (*) [2])0x1a83c6);
              }
              goto LAB_0016a8c9;
            }
            iVar5 = *local_80 + -1;
          }
          local_8c = *t + -1;
        }
        bVar3 = false;
      } while (details->real_errors != false);
      if (opt.debug != 0) {
        pLVar8 = util::operator<<((LogHelper *)&util::cout,RED);
        pLVar8 = util::operator<<(pLVar8,(char (*) [25])"FitTrack: unable to fit ");
        pLVar8 = util::operator<<(pLVar8,local_70);
        pLVar8 = util::operator<<(pLVar8,none);
        util::operator<<(pLVar8,(char (*) [2])0x1a83c6);
      }
      bVar3 = false;
LAB_0016a8c9:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&sizes.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  return bVar3;
}

Assistant:

bool FitTrackIBMPC(const CylHead& cylhead, const Track& track, int track_time_ms, FitDetails& details)
{
    if (track.empty() || track.is_mixed_encoding())
        return false;

    auto datarate = track[0].datarate;
    auto encoding = track[0].encoding;
    if (encoding != Encoding::MFM && encoding != Encoding::FM)
        return false;

    auto track_space = GetTrackCapacity(track_time_ms, datarate, encoding);
    auto sector_overhead = GetSectorOverhead(encoding);

    details.sector_units.resize(track.size());
    std::vector<int> sizes(track.size());
    int min_size, max_size;

    // Check both with real errors and dummy errors
    for (details.real_errors = true; ; details.real_errors = false)
    {
        bool all_errors = true;
        min_size = SIZE_MASK_765;
        max_size = 0;

        // Determine the largest and smallest true sector sizes.
        for (int i = 0; i < track.size(); ++i)
        {
            auto& s = track[i];

            if (!details.real_errors && !s.has_good_data())
                sizes[i] = -1;
            else
            {
                sizes[i] = Sector::SizeCodeToRealSizeCode(s.header.size);
                min_size = std::min(sizes[i], min_size);
                max_size = std::max(sizes[i], max_size);
                all_errors &= !s.has_good_data();
            }
        }

        // If all sectors are bad, consider the largest size that works.
        if (all_errors)
            max_size = SIZE_MASK_765;

        // Attempt to fit using simple size multiples, and either trusting or ignoring the size
        // of sectors that don't have a good data field.
        for (details.size_code = max_size; details.size_code >= 0; --details.size_code)
        {
            details.total_units = 0;
            for (int i = 0; i < track.size(); ++i)
            {
                details.sector_units[i] = (sizes[i] < 0 || sizes[i] < details.size_code) ? 1 :
                    (Sector::SizeCodeToLength(sizes[i]) / Sector::SizeCodeToLength(details.size_code));
                details.total_units += details.sector_units[i];
            }

            if (!details.total_units)
                continue;

            // Try standard format gaps, or calculate one that is suitable
            details.gap3 =
                GetFormatGap(track_time_ms, datarate, encoding, details.total_units, details.size_code);

            if (details.gap3)
            {
                // In debug, show the unit count wasn't obvious (unless forced)
                if (opt.debug && (details.total_units != track.size() || opt.verbose))
                    util::cout << "FitTrack: " << cylhead << " fits with " << details.total_units <<
                    " units of size=" << details.size_code << " gap3=" << details.gap3 << "\n";

                return true;
            }
        }

        // Attempt a more difficult fit using size and gap3 variations.
        for (details.size_code = min_size; details.size_code >= 0; --details.size_code)
        {
            for (details.gap3 = 255; details.gap3 > 0; --details.gap3)
            {
                auto unit_length =
                    sector_overhead + Sector::SizeCodeToLength(details.size_code) + details.gap3;

                details.total_units = 0;
                for (int i = 0; i < track.size(); ++i)
                {
                    auto needed_length = sector_overhead +
                        Sector::SizeCodeToLength(((sizes[i] < 0) ? details.size_code : sizes[i]));

                    details.sector_units[i] = (needed_length + unit_length - 1) / unit_length;
                    details.total_units += details.sector_units[i];
                }

                auto total_size =
                    GetFormatLength(encoding, details.total_units, details.size_code, details.gap3);
                if (total_size < track_space)
                {
                    if (opt.debug)
                        util::cout << "FitTrack: " << cylhead << " fits with " <<
                        details.total_units << " clipped units of size=" << details.size_code <<
                        " gap3=" << details.gap3 << "\n";
                    return true;
                }
            }
        }

        if (!details.real_errors)
            break;
    }

    if (opt.debug)
        util::cout << colour::RED << "FitTrack: unable to fit " << cylhead << colour::none << "\n";

    return false;
}